

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

sexp sexp_complex_copy(sexp ctx,sexp a)

{
  void *pvVar1;
  sexp psVar2;
  ulong uVar3;
  ulong uVar4;
  sexp psVar5;
  ulong uVar6;
  sexp res;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp local_50;
  sexp_gc_var_t local_48;
  
  local_48.var = &local_50;
  local_50 = (sexp)0x43e;
  local_48.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_48;
  local_50 = sexp_make_complex(ctx,(a->value).type.name,(a->value).type.cpl);
  psVar2 = (a->value).type.name;
  if (((ulong)psVar2 & 3) == 0) {
    if (psVar2->tag == 0xb) {
      psVar5 = sexp_make_flonum(ctx,(psVar2->value).flonum);
    }
    else {
      if ((((ulong)psVar2 & 3) != 0) || (psVar2->tag != 0xc)) goto LAB_0011d65e;
      uVar3 = (psVar2->value).string.offset;
      psVar5 = sexp_alloc_tagged_aux(ctx,uVar3 * 8 + 0x18,0xc);
      (psVar5->value).string.offset = uVar3;
      uVar4 = (psVar2->value).string.offset;
      uVar6 = uVar3;
      if (uVar4 < uVar3) {
        uVar6 = uVar4;
      }
      (psVar5->value).flonum_bits[0] = (psVar2->value).flonum_bits[0];
      pvVar1 = (void *)((long)&psVar5->value + 0x10);
      memset(pvVar1,0,uVar3 * 8);
      memmove(pvVar1,(void *)((long)&psVar2->value + 0x10),uVar6 << 3);
    }
    (a->value).type.name = psVar5;
  }
LAB_0011d65e:
  psVar2 = (a->value).type.cpl;
  if (((ulong)psVar2 & 3) == 0) {
    if (psVar2->tag == 0xb) {
      psVar5 = sexp_make_flonum(ctx,(psVar2->value).flonum);
    }
    else {
      if ((((ulong)psVar2 & 3) != 0) || (psVar2->tag != 0xc)) goto LAB_0011d6fe;
      uVar3 = (psVar2->value).string.offset;
      psVar5 = sexp_alloc_tagged_aux(ctx,uVar3 * 8 + 0x18,0xc);
      (psVar5->value).string.offset = uVar3;
      uVar4 = (psVar2->value).string.offset;
      uVar6 = uVar3;
      if (uVar4 < uVar3) {
        uVar6 = uVar4;
      }
      (psVar5->value).flonum_bits[0] = (psVar2->value).flonum_bits[0];
      pvVar1 = (void *)((long)&psVar5->value + 0x10);
      memset(pvVar1,0,uVar3 * 8);
      memmove(pvVar1,(void *)((long)&psVar2->value + 0x10),uVar6 << 3);
    }
    (a->value).type.cpl = psVar5;
  }
LAB_0011d6fe:
  (ctx->value).context.saves = local_48.next;
  return local_50;
}

Assistant:

static sexp sexp_complex_copy (sexp ctx, sexp a) {
  sexp_gc_var1(res);
  sexp_gc_preserve1(ctx, res);
  res = sexp_make_complex(ctx, sexp_complex_real(a), sexp_complex_imag(a));
  if (sexp_flonump(sexp_complex_real(a)))
    sexp_complex_real(a) = sexp_make_flonum(ctx, sexp_flonum_value(sexp_complex_real(a)));
  else if (sexp_bignump(sexp_complex_real(a)))
    sexp_complex_real(a) = sexp_copy_bignum(ctx, NULL, sexp_complex_real(a), 0);
  if (sexp_flonump(sexp_complex_imag(a)))
    sexp_complex_imag(a) = sexp_make_flonum(ctx, sexp_flonum_value(sexp_complex_imag(a)));
  else if (sexp_bignump(sexp_complex_imag(a)))
    sexp_complex_imag(a) = sexp_copy_bignum(ctx, NULL, sexp_complex_imag(a), 0);
  sexp_gc_release1(ctx);
  return res;
}